

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> * __thiscall
soul::ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL>::operator=
          (ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> *this,
          ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> *other)

{
  size_t sVar1;
  ulong local_30;
  size_t i_2;
  size_t i_1;
  size_t i;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> *other_local;
  ArrayWithPreallocation<soul::pool_ref<soul::AST::Connection::SharedEndpoint>,_8UL> *this_local;
  
  sVar1 = size(other);
  if (this->numActive < sVar1) {
    sVar1 = size(other);
    reserve(this,sVar1);
    for (i_1 = 0; i_1 < this->numActive; i_1 = i_1 + 1) {
      this->items[i_1].object = other->items[i_1].object;
    }
    for (i_2 = this->numActive; sVar1 = size(other), i_2 < sVar1; i_2 = i_2 + 1) {
      this->items[i_2].object = other->items[i_2].object;
    }
    sVar1 = size(other);
    this->numActive = sVar1;
  }
  else {
    sVar1 = size(other);
    shrink(this,sVar1);
    for (local_30 = 0; local_30 < this->numActive; local_30 = local_30 + 1) {
      this->items[local_30].object = other->items[local_30].object;
    }
  }
  return this;
}

Assistant:

ArrayWithPreallocation& operator= (const ArrayWithPreallocation& other)
    {
        if (other.size() > numActive)
        {
            reserve (other.size());

            for (size_t i = 0; i < numActive; ++i)
                items[i] = other.items[i];

            for (size_t i = numActive; i < other.size(); ++i)
                new (items + i) Item (other.items[i]);

            numActive = other.size();
        }
        else
        {
            shrink (other.size());

            for (size_t i = 0; i < numActive; ++i)
                items[i] = other.items[i];
        }

        return *this;
    }